

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.hpp
# Opt level: O2

ValueRangeAccess * __thiscall
rsg::ValueRangeAccess::member
          (ValueRangeAccess *__return_storage_ptr__,ValueRangeAccess *this,int memberNdx)

{
  Scalar *pSVar1;
  Scalar *pSVar2;
  int iVar3;
  
  iVar3 = VariableType::getMemberScalarOffset((this->super_ConstValueRangeAccess).m_type,memberNdx);
  pSVar1 = (this->super_ConstValueRangeAccess).m_min;
  pSVar2 = (this->super_ConstValueRangeAccess).m_max;
  (__return_storage_ptr__->super_ConstValueRangeAccess).m_type =
       (((this->super_ConstValueRangeAccess).m_type)->m_members).
       super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
       _M_impl.super__Vector_impl_data._M_start[memberNdx].m_type;
  (__return_storage_ptr__->super_ConstValueRangeAccess).m_min = pSVar1 + iVar3;
  (__return_storage_ptr__->super_ConstValueRangeAccess).m_max = pSVar2 + iVar3;
  return __return_storage_ptr__;
}

Assistant:

inline ValueRangeAccess ValueRangeAccess::member (int memberNdx)
{
	int offset = m_type->getMemberScalarOffset(memberNdx);
	return ValueRangeAccess(m_type->getMembers()[memberNdx].getType(), m_min + offset, m_max + offset);
}